

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor *descriptor;
  FieldGeneratorBase *pFVar1;
  int index;
  Descriptor *this_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text._M_str = "public void WriteTo(pb::CodedOutputStream output) {\n";
  text._M_len = 0x34;
  io::Printer::Print<>(printer,text);
  text_00._M_str = "#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n";
  text_00._M_len = 0x32;
  io::Printer::Print<>(printer,text_00);
  *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
  text_01._M_str = "output.WriteRawMessage(this);\n";
  text_01._M_len = 0x1e;
  io::Printer::Print<>(printer,text_01);
  google::protobuf::io::Printer::Outdent();
  text_02._M_str = "#else\n";
  text_02._M_len = 6;
  io::Printer::Print<>(printer,text_02);
  *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
  index = 0;
  GenerateWriteToBody(this,printer,false);
  google::protobuf::io::Printer::Outdent();
  text_03._M_str = "#endif\n";
  text_03._M_len = 7;
  io::Printer::Print<>(printer,text_03);
  text_04._M_str = "}\n\n";
  text_04._M_len = 3;
  io::Printer::Print<>(printer,text_04);
  text_05._M_str = "#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n";
  text_05._M_len = 0x32;
  io::Printer::Print<>(printer,text_05);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_06._M_str = "void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) {\n";
  text_06._M_len = 0x47;
  io::Printer::Print<>(printer,text_06);
  *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
  GenerateWriteToBody(this,printer,true);
  google::protobuf::io::Printer::Outdent();
  text_07._M_str = "}\n";
  text_07._M_len = 2;
  io::Printer::Print<>(printer,text_07);
  text_08._M_str = "#endif\n\n";
  text_08._M_len = 8;
  io::Printer::Print<>(printer,text_08);
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  text_09._M_str = "public int CalculateSize() {\n";
  text_09._M_len = 0x1d;
  io::Printer::Print<>(printer,text_09);
  *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58);
  text_10._M_str = "int size = 0;\n";
  text_10._M_len = 0xe;
  io::Printer::Print<>(printer,text_10);
  this_00 = this->descriptor_;
  if (0 < *(int *)(this_00 + 4)) {
    do {
      descriptor = Descriptor::field(this_00,index);
      pFVar1 = CreateFieldGeneratorInternal(this,descriptor);
      (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[0xc])(pFVar1,printer);
      (*(pFVar1->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar1);
      index = index + 1;
      this_00 = this->descriptor_;
    } while (index < *(int *)(this_00 + 4));
  }
  if (this->has_extension_ranges_ != false) {
    text_11._M_str = "if (_extensions != null) {\n  size += _extensions.CalculateSize();\n}\n";
    text_11._M_len = 0x44;
    io::Printer::Print<>(printer,text_11);
  }
  text_12._M_str = "if (_unknownFields != null) {\n  size += _unknownFields.CalculateSize();\n}\n";
  text_12._M_len = 0x4a;
  io::Printer::Print<>(printer,text_12);
  text_13._M_str = "return size;\n";
  text_13._M_len = 0xd;
  io::Printer::Print<>(printer,text_13);
  google::protobuf::io::Printer::Outdent();
  text_14._M_str = "}\n\n";
  text_14._M_len = 3;
  io::Printer::Print<>(printer,text_14);
  return;
}

Assistant:

void MessageGenerator::GenerateMessageSerializationMethods(
    io::Printer* printer) {
  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void WriteTo(pb::CodedOutputStream output) {\n");
  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  printer->Indent();
  printer->Print("output.WriteRawMessage(this);\n");
  printer->Outdent();
  printer->Print("#else\n");
  printer->Indent();
  GenerateWriteToBody(printer, false);
  printer->Outdent();
  printer->Print("#endif\n");
  printer->Print("}\n\n");

  printer->Print("#if !GOOGLE_PROTOBUF_REFSTRUCT_COMPATIBILITY_MODE\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "void pb::IBufferMessage.InternalWriteTo(ref pb::WriteContext output) "
      "{\n");
  printer->Indent();
  GenerateWriteToBody(printer, true);
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endif\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print("public int CalculateSize() {\n");
  printer->Indent();
  printer->Print("int size = 0;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->GenerateSerializedSizeCode(printer);
  }

  if (has_extension_ranges_) {
    printer->Print(
        "if (_extensions != null) {\n"
        "  size += _extensions.CalculateSize();\n"
        "}\n");
  }

  printer->Print(
      "if (_unknownFields != null) {\n"
      "  size += _unknownFields.CalculateSize();\n"
      "}\n");

  printer->Print("return size;\n");
  printer->Outdent();
  printer->Print("}\n\n");
}